

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::ScrollIntoView(Element *this,ScrollIntoViewOptions options)

{
  Box *this_00;
  Vector2f VVar1;
  ulong uVar2;
  Vector2f VVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  Vector2f VVar6;
  ulong uVar7;
  uint uVar8;
  Element *this_01;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_e8;
  ulong local_d0;
  ScrollParentage local_a0;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  
  local_d0 = options._8_8_;
  VVar3 = Box::GetSize(&this->main_box,Border);
  this_01 = this->parent;
  if (this_01 != (Element *)0x0) {
    uVar7 = local_d0 >> 0x20;
    do {
      uVar2 = *(ulong *)&(this_01->meta->computed_values).common;
      fVar10 = (this_01->scrollable_overflow_rectangle).x;
      this_00 = &this_01->main_box;
      VVar4 = Box::GetSize(this_00,Padding);
      fVar9 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,VERTICAL);
      local_e8 = VVar4.x;
      if (fVar10 <= local_e8 - fVar9) {
        fVar10 = local_e8 - fVar9;
      }
      fVar9 = (this_01->scrollable_overflow_rectangle).y;
      VVar4 = Box::GetSize(this_00,Padding);
      fVar11 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,HORIZONTAL);
      fVar11 = VVar4.y - fVar11;
      if (fVar9 <= fVar11) {
        fVar9 = fVar11;
      }
      VVar4 = Box::GetSize(this_00,Padding);
      fVar11 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,VERTICAL);
      local_e8 = VVar4.x;
      VVar4 = Box::GetSize(this_00,Padding);
      fVar12 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,HORIZONTAL);
      fVar12 = VVar4.y - fVar12;
      uVar8 = (uint)uVar2;
      if ((((byte)(uVar2 >> 0xb) & local_e8 - fVar11 < fVar10) != 0) ||
         (((byte)(uVar2 >> 0xd) & fVar12 < fVar9) != 0)) {
        UpdateAbsoluteOffsetAndRenderBoxData(this_01);
        VVar4 = this_01->absolute_offset;
        UpdateAbsoluteOffsetAndRenderBoxData(this);
        VVar1 = this->absolute_offset;
        fVar10 = (this_01->scroll_offset).x;
        fVar9 = (this_01->scroll_offset).y;
        VVar5 = Box::GetPosition(this_00,Padding);
        VVar6 = Box::GetPosition(this_00,Padding);
        fVar13 = 0.0;
        if ((uVar8 >> 0xb & 1) != 0) {
          local_58 = VVar4.x;
          local_68 = VVar1.x;
          local_48 = VVar5.x;
          local_48 = local_48 - (local_58 - local_68);
          local_78 = VVar3.x;
          fVar13 = GetScrollOffsetDelta
                             (options.horizontal,local_48,
                              (local_78 + local_48) - (local_e8 - fVar11));
        }
        fVar11 = 0.0;
        if ((uVar8 >> 0xd & 1) != 0) {
          fStack_54 = VVar4.y;
          fStack_64 = VVar1.y;
          fVar11 = VVar6.y - (fStack_54 - fStack_64);
          fStack_74 = VVar3.y;
          fVar11 = GetScrollOffsetDelta(options.vertical,fVar11,(fStack_74 + fVar11) - fVar12);
        }
        VVar4.y = fVar9 + fVar11;
        VVar4.x = fVar10 + fVar13;
        ScrollTo(this_01,VVar4,(ScrollBehavior)local_d0);
        local_d0 = 2;
      }
      if ((uVar8 >> 0xb & 1) == 0) {
        if (((byte)(uVar8 >> 0xd) & uVar7 == 1) != 0) {
          return;
        }
      }
      else {
        local_a0 = options.parentage;
        if (local_a0 == Closest) {
          return;
        }
      }
      this_01 = this_01->parent;
    } while (this_01 != (Element *)0x0);
  }
  return;
}

Assistant:

void Element::ScrollIntoView(const ScrollIntoViewOptions options)
{
	const Vector2f size = main_box.GetSize(BoxArea::Border);
	ScrollBehavior scroll_behavior = options.behavior;

	for (Element* scroll_parent = parent; scroll_parent; scroll_parent = scroll_parent->GetParentNode())
	{
		using Style::Overflow;
		const ComputedValues& computed = scroll_parent->GetComputedValues();
		const bool scrollable_box_x = (computed.overflow_x() != Overflow::Visible && computed.overflow_x() != Overflow::Hidden);
		const bool scrollable_box_y = (computed.overflow_y() != Overflow::Visible && computed.overflow_y() != Overflow::Hidden);

		const Vector2f parent_scroll_size = {scroll_parent->GetScrollWidth(), scroll_parent->GetScrollHeight()};
		const Vector2f parent_client_size = {scroll_parent->GetClientWidth(), scroll_parent->GetClientHeight()};

		if ((scrollable_box_x && parent_scroll_size.x > parent_client_size.x) || (scrollable_box_y && parent_scroll_size.y > parent_client_size.y))
		{
			const Vector2f relative_offset = scroll_parent->GetAbsoluteOffset(BoxArea::Border) - GetAbsoluteOffset(BoxArea::Border);

			const Vector2f old_scroll_offset = {scroll_parent->GetScrollLeft(), scroll_parent->GetScrollTop()};
			const Vector2f parent_client_offset = {scroll_parent->GetClientLeft(), scroll_parent->GetClientTop()};

			const Vector2f delta_scroll_offset_start = parent_client_offset - relative_offset;
			const Vector2f delta_scroll_offset_end = delta_scroll_offset_start + size - parent_client_size;

			Vector2f scroll_delta = {
				scrollable_box_x ? GetScrollOffsetDelta(options.horizontal, delta_scroll_offset_start.x, delta_scroll_offset_end.x) : 0.f,
				scrollable_box_y ? GetScrollOffsetDelta(options.vertical, delta_scroll_offset_start.y, delta_scroll_offset_end.y) : 0.f,
			};

			scroll_parent->ScrollTo(old_scroll_offset + scroll_delta, scroll_behavior);

			// Currently, only a single scrollable parent can be smooth scrolled at a time, so any other parents must be instant scrolled.
			scroll_behavior = ScrollBehavior::Instant;
		}

		if ((scrollable_box_x || scrollable_box_y) && options.parentage == ScrollParentage::Closest)
			break;
	}
}